

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDynamicRowMatrix.cpp
# Opt level: O0

void __thiscall HighsDynamicRowMatrix::unlinkColumns(HighsDynamicRowMatrix *this,HighsInt rowindex)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  int in_ESI;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_RDI;
  HighsInt next_1;
  HighsInt prev_1;
  HighsInt next;
  HighsInt prev;
  HighsInt col;
  HighsInt i;
  HighsInt end;
  HighsInt start;
  int local_18;
  
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 10),
                      (long)in_ESI);
  if (*pvVar5 != '\0') {
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 10),
                        (long)in_ESI);
    *pvVar5 = '\0';
    pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (in_RDI,(long)in_ESI);
    local_18 = pvVar6->first;
    pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (in_RDI,(long)in_ESI);
    iVar1 = pvVar6->second;
    for (; local_18 != iVar1; local_18 = local_18 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 1),(long)local_18);
      iVar2 = *pvVar7;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 2),(long)local_18);
      if (*pvVar8 <= 0.0) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 7),(long)local_18);
        iVar3 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)local_18);
        iVar4 = *pvVar7;
        if (iVar4 != -1) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 7),(long)iVar4);
          *pvVar7 = iVar3;
        }
        if (iVar3 == -1) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 9),(long)iVar2);
          *pvVar7 = iVar4;
        }
        else {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)iVar3);
          *pvVar7 = iVar4;
        }
      }
      else {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 5),(long)local_18);
        iVar3 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),(long)local_18);
        iVar4 = *pvVar7;
        if (iVar4 != -1) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 5),(long)iVar4);
          *pvVar7 = iVar3;
        }
        if (iVar3 == -1) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)iVar2);
          *pvVar7 = iVar4;
        }
        else {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),(long)iVar3);
          *pvVar7 = iVar4;
        }
      }
    }
  }
  return;
}

Assistant:

void HighsDynamicRowMatrix::unlinkColumns(HighsInt rowindex) {
  if (!colsLinked[rowindex]) return;

  colsLinked[rowindex] = false;
  HighsInt start = ARrange_[rowindex].first;
  HighsInt end = ARrange_[rowindex].second;
  for (HighsInt i = start; i != end; ++i) {
    HighsInt col = ARindex_[i];

    if (ARvalue_[i] > 0) {
      HighsInt prev = AprevPos_[i];
      HighsInt next = AnextPos_[i];

      if (next != -1) {
        assert(AprevPos_[next] == i);
        AprevPos_[next] = prev;
      }

      if (prev != -1) {
        assert(AnextPos_[prev] == i);
        AnextPos_[prev] = next;
      } else {
        assert(AheadPos_[col] == i);
        AheadPos_[col] = next;
      }
    } else {
      HighsInt prev = AprevNeg_[i];
      HighsInt next = AnextNeg_[i];

      if (next != -1) {
        assert(AprevNeg_[next] == i);
        AprevNeg_[next] = prev;
      }

      if (prev != -1) {
        assert(AnextNeg_[prev] == i);
        AnextNeg_[prev] = next;
      } else {
        assert(AheadNeg_[col] == i);
        AheadNeg_[col] = next;
      }
    }
  }
}